

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.cpp
# Opt level: O1

void __thiscall DTreePropagator::explain_cycle(DTreePropagator *this,int u,int v,vec<Lit> *pathe)

{
  BoolView *pBVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  vector<int,_std::allocator<int>_> pathn;
  Lit local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  RerootedUnionFind<Tint>::connectionsFromTo(&local_48,&this->ruf,u,v);
  if ((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 4) {
    uVar3 = 1;
    uVar4 = 0;
    do {
      uVar5 = (ulong)uVar3;
      uVar2 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                _vptr_Propagator[0x17])
                        (this,(ulong)(uint)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar4],
                         (ulong)(uint)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start[uVar5]);
      if (uVar2 == 0xffffffff) {
LAB_0017e6b9:
        uVar2 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                  _vptr_Propagator[0x17])
                          (this,(ulong)(uint)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start[uVar5],
                           (ulong)(uint)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[uVar4]);
      }
      else {
        pBVar1 = (this->super_DReachabilityPropagator).super_GraphPropagator.es.data;
        if ((sat.assigns.data[(uint)pBVar1[uVar2].v] == '\0') ||
           ((uint)pBVar1[uVar2].s * 2 + -1 == (int)sat.assigns.data[(uint)pBVar1[uVar2].v]))
        goto LAB_0017e6b9;
      }
      uVar2 = (this->super_DReachabilityPropagator).super_GraphPropagator.es.data[uVar2].v;
      local_4c.x = (uint)((int)sat.assigns.data[uVar2] - 1U < 0xfffffffd) + uVar2 * 2;
      vec<Lit>::push(pathe,&local_4c);
      uVar3 = uVar3 + 1;
      uVar4 = uVar5;
    } while (uVar5 < ((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) - 1U);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DTreePropagator::explain_cycle(int u, int v, vec<Lit>& pathe) {
	assert(u != v);
	std::vector<int> pathn = ruf.connectionsFromTo(u, v);
	assert(!pathn.empty());
	for (unsigned int k = 0; k < pathn.size() - 1; k++) {
		int de = findEdge(pathn[k], pathn[k + 1]);
		if (de == -1 || !getEdgeVar(de).isFixed() || getEdgeVar(de).isFalse()) {
			de = findEdge(pathn[k + 1], pathn[k]);
		}
		assert(de != -1);
		assert(getEdgeVar(de).isFixed());
		assert(getEdgeVar(de).isTrue());
		pathe.push(getEdgeVar(de).getValLit());
	}
}